

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit(V *values,int num_keys,int data_capacity,StatAccumulator *acc,
                        LinearModel<int> *model)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM2_Qb;
  
  if (0 < num_keys) {
    uVar6 = 0xffffffff;
    uVar5 = 0;
    uVar4 = data_capacity - 1;
    iVar7 = num_keys;
    do {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = model->a_;
      auVar10._0_8_ = (double)values[uVar5].first;
      auVar10._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = model->b_;
      auVar1 = vfmadd213sd_fma(auVar10,auVar8,auVar1);
      uVar3 = uVar4;
      if ((int)auVar1._0_8_ <= (int)uVar4) {
        uVar3 = (int)auVar1._0_8_;
      }
      uVar6 = uVar6 + 1;
      uVar3 = ~((int)uVar3 >> 0x1f) & uVar3;
      if ((int)uVar6 < (int)uVar3) {
        uVar6 = uVar3;
      }
      if ((int)(data_capacity - uVar6) < iVar7) {
        if (num_keys <= (int)uVar5) {
          return;
        }
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = model->a_;
          auVar11._0_8_ = (double)values[uVar5].first;
          auVar11._8_8_ = in_XMM2_Qb;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = model->b_;
          auVar1 = vfmadd213sd_fma(auVar11,auVar9,auVar2);
          uVar6 = uVar4;
          if ((int)auVar1._0_8_ <= (int)uVar4) {
            uVar6 = (int)auVar1._0_8_;
          }
          (*acc->_vptr_StatAccumulator[2])
                    (acc,(ulong)(uint)((data_capacity - num_keys) + (int)uVar5),
                     (ulong)(~((int)uVar6 >> 0x1f) & uVar6));
          uVar5 = uVar5 + 1;
        } while ((uint)num_keys != uVar5);
        return;
      }
      (*acc->_vptr_StatAccumulator[2])(acc,(ulong)uVar6);
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (uVar5 != (uint)num_keys);
  }
  return;
}

Assistant:

static void build_node_implicit(const V* values, int num_keys,
                                  int data_capacity, StatAccumulator* acc,
                                  const LinearModel<T>* model) {
    int last_position = -1;
    int keys_remaining = num_keys;
    for (int i = 0; i < num_keys; i++) {
      int predicted_position = std::max(
          0, std::min(data_capacity - 1, model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = data_capacity - actual_position;
      if (positions_remaining < keys_remaining) {
        actual_position = data_capacity - keys_remaining;
        for (int j = i; j < num_keys; j++) {
          predicted_position = std::max(
              0, std::min(data_capacity - 1, model->predict(values[j].first)));
          acc->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      acc->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      keys_remaining--;
    }
  }